

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

path * __thiscall
boost::filesystem::path::lexically_relative(path *__return_storage_ptr__,path *this,path *base)

{
  size_type sVar1;
  size_type sVar2;
  path *ppVar3;
  path *ppVar4;
  path *tmp;
  iterator itr_2;
  pair<boost::filesystem::path::iterator,_boost::filesystem::path::iterator> mm;
  iterator itr_3;
  iterator itr_1;
  iterator itr;
  iterator local_1b0;
  pair<boost::filesystem::path::iterator,_boost::filesystem::path::iterator> local_180;
  iterator local_120;
  iterator local_f0;
  iterator local_c0;
  iterator local_90;
  iterator local_60;
  
  begin(&local_60,this);
  local_90.m_element.m_pathname._M_dataplus._M_p = (pointer)&local_90.m_element.m_pathname.field_2;
  local_90.m_element.m_pathname._M_string_length = 0;
  local_90.m_element.m_pathname.field_2._M_local_buf[0] = '\0';
  local_90.m_pos = (this->m_pathname)._M_string_length;
  local_90.m_path_ptr = this;
  begin(&local_c0,base);
  local_f0.m_element.m_pathname._M_dataplus._M_p = (pointer)&local_f0.m_element.m_pathname.field_2;
  local_f0.m_element.m_pathname._M_string_length = 0;
  local_f0.m_element.m_pathname.field_2._M_local_buf[0] = '\0';
  local_f0.m_pos = (base->m_pathname)._M_string_length;
  local_f0.m_path_ptr = base;
  detail::mismatch(&local_180,&local_60,&local_90,&local_c0,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_60);
  begin(&local_1b0,this);
  if ((local_180.first.m_path_ptr == local_1b0.m_path_ptr) &&
     (local_180.first.m_pos == local_1b0.m_pos)) {
    begin(&local_120,base);
    sVar1 = local_120.m_pos;
    ppVar4 = local_120.m_path_ptr;
    sVar2 = local_180.second.m_pos;
    ppVar3 = local_180.second.m_path_ptr;
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_1b0);
    if ((ppVar3 == ppVar4) && (sVar2 == sVar1)) {
      (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_pathname).field_2;
      (__return_storage_ptr__->m_pathname)._M_string_length = 0;
      (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
      goto LAB_0010fe9e;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  sVar2 = local_180.second.m_pos;
  ppVar3 = local_180.second.m_path_ptr;
  local_1b0.m_element.m_pathname._M_dataplus._M_p = (pointer)&local_1b0.m_element.m_pathname.field_2
  ;
  local_1b0.m_element.m_pathname._M_string_length = 0;
  local_1b0.m_element.m_pathname.field_2._M_local_buf[0] = '\0';
  local_1b0.m_pos = (this->m_pathname)._M_string_length;
  local_1b0.m_path_ptr = this;
  if ((local_180.first.m_path_ptr == this) && (local_180.first.m_pos == local_1b0.m_pos)) {
    local_120.m_element.m_pathname._M_dataplus._M_p =
         (pointer)&local_120.m_element.m_pathname.field_2;
    local_120.m_element.m_pathname._M_string_length = 0;
    local_120.m_element.m_pathname.field_2._M_local_buf[0] = '\0';
    sVar1 = (base->m_pathname)._M_string_length;
    local_120.m_path_ptr = base;
    local_120.m_pos = sVar1;
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_1b0);
    if ((ppVar3 == base) && (sVar2 == sVar1)) {
      detail::dot_path();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,(string *)&detail::dot_path::dot_pth);
      goto LAB_0010fe9e;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_pathname).field_2;
  (__return_storage_ptr__->m_pathname)._M_string_length = 0;
  (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
  while( true ) {
    sVar1 = local_180.second.m_pos;
    ppVar3 = local_180.second.m_path_ptr;
    local_1b0.m_element.m_pathname._M_dataplus._M_p =
         (pointer)&local_1b0.m_element.m_pathname.field_2;
    local_1b0.m_element.m_pathname._M_string_length = 0;
    local_1b0.m_element.m_pathname.field_2._M_local_buf[0] = '\0';
    sVar2 = (base->m_pathname)._M_string_length;
    local_1b0.m_path_ptr = base;
    local_1b0.m_pos = sVar2;
    std::__cxx11::string::~string((string *)&local_1b0);
    if ((ppVar3 == base) && (sVar1 == sVar2)) break;
    detail::dot_dot_path();
    operator/=(__return_storage_ptr__,&detail::dot_dot_path::dot_dot);
    m_path_iterator_increment(&local_180.second);
  }
  while( true ) {
    sVar1 = local_180.first.m_pos;
    ppVar3 = local_180.first.m_path_ptr;
    local_1b0.m_element.m_pathname._M_dataplus._M_p =
         (pointer)&local_1b0.m_element.m_pathname.field_2;
    local_1b0.m_element.m_pathname._M_string_length = 0;
    local_1b0.m_element.m_pathname.field_2._M_local_buf[0] = '\0';
    sVar2 = (this->m_pathname)._M_string_length;
    local_1b0.m_path_ptr = this;
    local_1b0.m_pos = sVar2;
    std::__cxx11::string::~string((string *)&local_1b0);
    if ((ppVar3 == this) && (sVar1 == sVar2)) break;
    operator/=(__return_storage_ptr__,(path *)&local_180);
    m_path_iterator_increment(&local_180.first);
  }
LAB_0010fe9e:
  std::pair<boost::filesystem::path::iterator,_boost::filesystem::path::iterator>::~pair(&local_180)
  ;
  return __return_storage_ptr__;
}

Assistant:

path path::lexically_relative(const path& base) const
  {
    std::pair<path::iterator, path::iterator> mm
      = detail::mismatch(begin(), end(), base.begin(), base.end());
    if (mm.first == begin() && mm.second == base.begin())
      return path();
    if (mm.first == end() && mm.second == base.end())
      return detail::dot_path();
    path tmp;
    for (; mm.second != base.end(); ++mm.second)
      tmp /= detail::dot_dot_path();
    for (; mm.first != end(); ++mm.first)
      tmp /= *mm.first;
    return tmp;
  }